

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O0

void PointLight_set(void *super,Vec3fa *position,Vec3fa *power,float radius)

{
  undefined8 uVar1;
  PointLight *self;
  float radius_local;
  Vec3fa *power_local;
  Vec3fa *position_local;
  void *super_local;
  
  uVar1 = *(undefined8 *)((long)&position->field_0 + 8);
  *(undefined8 *)((long)super + 0x10) = *(undefined8 *)&position->field_0;
  *(undefined8 *)((long)super + 0x18) = uVar1;
  uVar1 = *(undefined8 *)((long)&power->field_0 + 8);
  *(undefined8 *)((long)super + 0x20) = *(undefined8 *)&power->field_0;
  *(undefined8 *)((long)super + 0x28) = uVar1;
  *(float *)((long)super + 0x30) = radius;
  return;
}

Assistant:

void PointLight_set(void* super,
                           const Vec3fa& position,
                           const Vec3fa& power,
                           float radius)
{
  PointLight* self = (PointLight*)super;
  self->position = position;
  self->power = power;
  self->radius = radius;
}